

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

void LZ4_memcpy_using_offset_base(BYTE *dstPtr,BYTE *srcPtr,BYTE *dstEnd,size_t offset)

{
  uint uVar1;
  size_t offset_local;
  BYTE *dstEnd_local;
  BYTE *srcPtr_local;
  BYTE *dstPtr_local;
  
  if (offset < 8) {
    *dstPtr = *srcPtr;
    dstPtr[1] = srcPtr[1];
    dstPtr[2] = srcPtr[2];
    dstPtr[3] = srcPtr[3];
    uVar1 = inc32table[offset];
    *(undefined4 *)(dstPtr + 4) = *(undefined4 *)(srcPtr + uVar1);
    dstEnd_local = srcPtr + uVar1 + -(long)dec64table[offset];
  }
  else {
    *(undefined8 *)dstPtr = *(undefined8 *)srcPtr;
    dstEnd_local = srcPtr + 8;
  }
  srcPtr_local = dstPtr + 8;
  LZ4_wildCopy8(srcPtr_local,dstEnd_local,dstEnd);
  return;
}

Assistant:

LZ4_FORCE_O2_INLINE_GCC_PPC64LE void
LZ4_memcpy_using_offset_base(BYTE* dstPtr, const BYTE* srcPtr, BYTE* dstEnd, const size_t offset)
{
    if (offset < 8) {
        dstPtr[0] = srcPtr[0];
        dstPtr[1] = srcPtr[1];
        dstPtr[2] = srcPtr[2];
        dstPtr[3] = srcPtr[3];
        srcPtr += inc32table[offset];
        memcpy(dstPtr+4, srcPtr, 4);
        srcPtr -= dec64table[offset];
        dstPtr += 8;
    } else {
        memcpy(dstPtr, srcPtr, 8);
        dstPtr += 8;
        srcPtr += 8;
    }

    LZ4_wildCopy8(dstPtr, srcPtr, dstEnd);
}